

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O0

int lj_obj_equal(cTValue *o1,cTValue *o2)

{
  cTValue *o2_local;
  cTValue *o1_local;
  
  if ((o1->field_2).it == (o2->field_2).it) {
    if (0xfffffffc < (o1->field_2).it) {
      return 1;
    }
    if (0xfffefffe < (o1->field_2).it) {
      return (uint)((o1->u32).lo == (o2->u32).lo);
    }
  }
  else if ((0xfffeffff < (o1->field_2).it) || (0xfffeffff < (o2->field_2).it)) {
    return 0;
  }
  return (uint)(o1->n == o2->n);
}

Assistant:

int lj_obj_equal(cTValue *o1, cTValue *o2)
{
  if (itype(o1) == itype(o2)) {
    if (tvispri(o1))
      return 1;
    if (!tvisnum(o1))
      return gcrefeq(o1->gcr, o2->gcr);
  } else if (!tvisnumber(o1) || !tvisnumber(o2)) {
    return 0;
  }
  return numberVnum(o1) == numberVnum(o2);
}